

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O1

void __thiscall
Eigen::internal::
gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
::operator()(gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
             *this,float *blockB,blas_data_mapper<float,_long,_0,_0,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  float *pfVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long j2;
  ulong uVar30;
  long lVar31;
  
  if ((depth <= stride) && (offset <= stride)) {
    uVar22 = cols + 3;
    if (-1 < cols) {
      uVar22 = cols;
    }
    uVar30 = uVar22 & 0xfffffffffffffffc;
    uVar21 = depth + 3;
    if (-1 < depth) {
      uVar21 = depth;
    }
    if (cols < 4) {
      lVar26 = 0;
    }
    else {
      lVar25 = 0xc;
      lVar28 = 8;
      lVar19 = 4;
      lVar27 = 0;
      lVar29 = 0;
      lVar26 = 0;
      do {
        lVar26 = lVar26 + offset * 4;
        pfVar23 = rhs->m_data;
        lVar3 = rhs->m_stride;
        if (depth < 4) {
          lVar31 = 0;
        }
        else {
          lVar31 = 0;
          do {
            pfVar2 = (float *)((long)pfVar23 + lVar31 * 4 + lVar3 * lVar27);
            fVar4 = pfVar2[1];
            fVar5 = pfVar2[2];
            fVar6 = pfVar2[3];
            pfVar1 = (float *)((long)pfVar23 + lVar31 * 4 + lVar3 * lVar19);
            fVar7 = *pfVar1;
            fVar8 = pfVar1[1];
            fVar9 = pfVar1[2];
            fVar10 = pfVar1[3];
            pfVar1 = (float *)((long)pfVar23 + lVar31 * 4 + lVar3 * lVar28);
            fVar11 = *pfVar1;
            fVar12 = pfVar1[1];
            fVar13 = pfVar1[2];
            fVar14 = pfVar1[3];
            pfVar1 = (float *)((long)pfVar23 + lVar31 * 4 + lVar3 * lVar25);
            fVar15 = *pfVar1;
            fVar16 = pfVar1[1];
            fVar17 = pfVar1[2];
            fVar18 = pfVar1[3];
            pfVar1 = blockB + lVar26;
            *pfVar1 = *pfVar2;
            pfVar1[1] = fVar7;
            pfVar1[2] = fVar11;
            pfVar1[3] = fVar15;
            pfVar1 = blockB + lVar26 + 4;
            *pfVar1 = fVar4;
            pfVar1[1] = fVar8;
            pfVar1[2] = fVar12;
            pfVar1[3] = fVar16;
            pfVar1 = blockB + lVar26 + 8;
            *pfVar1 = fVar5;
            pfVar1[1] = fVar9;
            pfVar1[2] = fVar13;
            pfVar1[3] = fVar17;
            pfVar1 = blockB + lVar26 + 0xc;
            *pfVar1 = fVar6;
            pfVar1[1] = fVar10;
            pfVar1[2] = fVar14;
            pfVar1[3] = fVar18;
            lVar26 = lVar26 + 0x10;
            lVar31 = lVar31 + 4;
          } while (lVar31 < (long)(uVar21 & 0xfffffffffffffffc));
        }
        lVar20 = depth - lVar31;
        if (lVar20 != 0 && lVar31 <= depth) {
          lVar24 = 0;
          do {
            blockB[lVar26 + lVar24] =
                 *(float *)((long)pfVar23 + lVar24 + lVar31 * 4 + lVar3 * lVar27);
            blockB[lVar26 + lVar24 + 1] =
                 *(float *)((long)pfVar23 + lVar24 + lVar3 * lVar19 + lVar31 * 4);
            blockB[lVar26 + lVar24 + 2] =
                 *(float *)((long)pfVar23 + lVar24 + lVar3 * lVar28 + lVar31 * 4);
            blockB[lVar26 + lVar24 + 3] =
                 *(float *)((long)pfVar23 + lVar24 + lVar3 * lVar25 + lVar31 * 4);
            lVar24 = lVar24 + 4;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
          lVar26 = lVar26 + lVar24;
        }
        lVar26 = lVar26 + (stride - (offset + depth)) * 4;
        lVar29 = lVar29 + 4;
        lVar25 = lVar25 + 0x10;
        lVar28 = lVar28 + 0x10;
        lVar19 = lVar19 + 0x10;
        lVar27 = lVar27 + 0x10;
      } while (lVar29 < (long)uVar30);
    }
    if ((long)uVar30 < cols) {
      lVar19 = rhs->m_stride;
      pfVar23 = rhs->m_data + ((long)uVar22 >> 2) * lVar19 * 4;
      do {
        lVar26 = lVar26 + offset;
        if (0 < depth) {
          lVar25 = 0;
          do {
            blockB[lVar26 + lVar25] = pfVar23[lVar25];
            lVar25 = lVar25 + 1;
          } while (depth != lVar25);
          lVar26 = lVar26 + lVar25;
        }
        lVar26 = lVar26 + ((stride - depth) - offset);
        uVar30 = uVar30 + 1;
        pfVar23 = pfVar23 + lVar19;
      } while (uVar30 != cols);
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x958,
                "void Eigen::internal::gemm_pack_rhs<float, long, Eigen::internal::blas_data_mapper<float, long, 0>, 4, 0, false, true>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = float, Index = long, DataMapper = Eigen::internal::blas_data_mapper<float, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enable vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0           ] = dm0.template loadPacket<Packet>(k);
          kernel.packet[1%PacketSize] = dm1.template loadPacket<Packet>(k);
          kernel.packet[2%PacketSize] = dm2.template loadPacket<Packet>(k);
          kernel.packet[3%PacketSize] = dm3.template loadPacket<Packet>(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}